

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.hpp
# Opt level: O0

void __thiscall burst::dynamic_tuple::swap(dynamic_tuple *this,dynamic_tuple *that)

{
  dynamic_tuple *that_local;
  dynamic_tuple *this_local;
  
  std::swap<unsigned_long>(&this->m_capacity,&that->m_capacity);
  std::swap<signed_char[],std::default_delete<signed_char[]>>(&this->m_data,&that->m_data);
  std::swap<burst::management::object_info_t,std::allocator<burst::management::object_info_t>>
            (&this->m_objects,&that->m_objects);
  std::swap<unsigned_long>(&this->m_volume,&that->m_volume);
  return;
}

Assistant:

void swap (dynamic_tuple & that)
        {
            using std::swap;

            swap(this->m_capacity, that.m_capacity);
            swap(this->m_data, that.m_data);
            swap(this->m_objects, that.m_objects);
            swap(this->m_volume, that.m_volume);
        }